

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

value * __thiscall cppcms::json::value::at(value *this,char *path)

{
  value *pvVar1;
  bad_value_cast *this_00;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pvVar1 = find(this,path);
  if ((((pvVar1->d).d.ptr_)->value_).type != is_undefined) {
    return pvVar1;
  }
  this_00 = (bad_value_cast *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string((string *)&local_58,"Value not found at ",&local_59);
  std::operator+(&local_38,&local_58,path);
  bad_value_cast::bad_value_cast(this_00,&local_38);
  __cxa_throw(this_00,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
}

Assistant:

value const &value::at(char const *path) const
	{
		value const &v=find(path);
		if(v.is_undefined())
			throw bad_value_cast(std::string("Value not found at ")+path );
		return v;
	}